

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_aead_decrypt(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *nonce,size_t nonce_length,
                uint8_t *additional_data,size_t additional_data_length,uint8_t *ciphertext,
                size_t ciphertext_length,uint8_t *plaintext,size_t plaintext_size,
                size_t *plaintext_length)

{
  uchar *tag;
  psa_status_t pVar1;
  int ret;
  size_t length;
  ulong tag_len;
  aead_operation_t operation;
  
  *plaintext_length = 0;
  pVar1 = psa_aead_setup(&operation,handle,0x200,alg);
  if (pVar1 != 0) {
    return pVar1;
  }
  tag_len = (ulong)operation.tag_length;
  pVar1 = -0x87;
  length = ciphertext_length - tag_len;
  if ((tag_len <= ciphertext_length) && (pVar1 = -0x8a, length <= plaintext_size)) {
    tag = ciphertext + length;
    if (operation.core_alg == 0x6001005) {
      pVar1 = -0x86;
      if ((nonce_length != 0xc) || (operation.tag_length != '\x10')) goto LAB_0011480e;
      ret = mbedtls_chachapoly_auth_decrypt
                      (&operation.ctx.chachapoly,length,nonce,additional_data,additional_data_length
                       ,tag,ciphertext,plaintext);
    }
    else if (operation.core_alg == 0x6401001) {
      ret = mbedtls_ccm_auth_decrypt
                      (&operation.ctx.ccm,length,nonce,nonce_length,additional_data,
                       additional_data_length,ciphertext,plaintext,tag,tag_len);
    }
    else {
      if (operation.core_alg != 0x6401002) {
        return -0x86;
      }
      ret = mbedtls_gcm_auth_decrypt
                      (&operation.ctx.gcm,length,nonce,nonce_length,additional_data,
                       additional_data_length,tag,tag_len,ciphertext,plaintext);
    }
    pVar1 = mbedtls_to_psa_error(ret);
    if ((plaintext_size != 0) && (pVar1 != 0)) {
      memset(plaintext,0,plaintext_size);
    }
  }
LAB_0011480e:
  psa_aead_abort_internal(&operation);
  if (pVar1 == 0) {
    *plaintext_length = ciphertext_length - operation.tag_length;
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_aead_decrypt( psa_key_handle_t handle,
                               psa_algorithm_t alg,
                               const uint8_t *nonce,
                               size_t nonce_length,
                               const uint8_t *additional_data,
                               size_t additional_data_length,
                               const uint8_t *ciphertext,
                               size_t ciphertext_length,
                               uint8_t *plaintext,
                               size_t plaintext_size,
                               size_t *plaintext_length )
{
    psa_status_t status;
    aead_operation_t operation;
    const uint8_t *tag = NULL;

    *plaintext_length = 0;

    status = psa_aead_setup( &operation, handle, PSA_KEY_USAGE_DECRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_aead_unpadded_locate_tag( operation.tag_length,
                                           ciphertext, ciphertext_length,
                                           plaintext_size, &tag );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_GCM_C)
    if( operation.core_alg == PSA_ALG_GCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_gcm_auth_decrypt( &operation.ctx.gcm,
                                      ciphertext_length - operation.tag_length,
                                      nonce, nonce_length,
                                      additional_data,
                                      additional_data_length,
                                      tag, operation.tag_length,
                                      ciphertext, plaintext ) );
    }
    else
#endif /* MBEDTLS_GCM_C */
#if defined(MBEDTLS_CCM_C)
    if( operation.core_alg == PSA_ALG_CCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_ccm_auth_decrypt( &operation.ctx.ccm,
                                      ciphertext_length - operation.tag_length,
                                      nonce, nonce_length,
                                      additional_data,
                                      additional_data_length,
                                      ciphertext, plaintext,
                                      tag, operation.tag_length ) );
    }
    else
#endif /* MBEDTLS_CCM_C */
#if defined(MBEDTLS_CHACHAPOLY_C)
    if( operation.core_alg == PSA_ALG_CHACHA20_POLY1305 )
    {
        if( nonce_length != 12 || operation.tag_length != 16 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = mbedtls_to_psa_error(
            mbedtls_chachapoly_auth_decrypt( &operation.ctx.chachapoly,
                                             ciphertext_length - operation.tag_length,
                                             nonce,
                                             additional_data,
                                             additional_data_length,
                                             tag,
                                             ciphertext,
                                             plaintext ) );
    }
    else
#endif /* MBEDTLS_CHACHAPOLY_C */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status != PSA_SUCCESS && plaintext_size != 0 )
        memset( plaintext, 0, plaintext_size );

exit:
    psa_aead_abort_internal( &operation );
    if( status == PSA_SUCCESS )
        *plaintext_length = ciphertext_length - operation.tag_length;
    return( status );
}